

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O2

void av1_decoder_remove(AV1Decoder *pbi)

{
  DecWorkerData *memblk;
  ThreadData *thread_data;
  AVxWorker *pAVar1;
  AVxWorkerInterface *pAVar2;
  long lVar3;
  int worker_idx;
  long lVar4;
  
  if (pbi != (AV1Decoder *)0x0) {
    aom_free_frame_buffer(&pbi->tile_list_outbuf);
    pAVar2 = aom_get_worker_interface();
    (*pAVar2->end)(&pbi->lf_worker);
    aom_free((pbi->lf_worker).data1);
    if (pbi->thread_data != (DecWorkerData *)0x0) {
      lVar3 = 0x1b0;
      for (lVar4 = 1; memblk = pbi->thread_data, lVar4 < pbi->num_workers; lVar4 = lVar4 + 1) {
        thread_data = *(ThreadData **)((memblk->error_info).detail + lVar3 + -0x18);
        if (thread_data != (ThreadData *)0x0) {
          av1_free_mc_tmp_buf(thread_data);
          aom_free(*(void **)((memblk->error_info).detail + lVar3 + -0x18));
        }
        lVar3 = lVar3 + 0x1b0;
      }
      aom_free(memblk);
    }
    aom_free((pbi->dcb).xd.seg_mask);
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < pbi->num_workers; lVar4 = lVar4 + 1) {
      pAVar1 = pbi->tile_workers;
      pAVar2 = aom_get_worker_interface();
      (*pAVar2->end)((AVxWorker *)((long)&pAVar1->impl_ + lVar3));
      lVar3 = lVar3 + 0x38;
    }
    if (pbi->row_mt_mutex_ != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)pbi->row_mt_mutex_);
      aom_free(pbi->row_mt_mutex_);
    }
    if ((pthread_cond_t *)pbi->row_mt_cond_ != (pthread_cond_t *)0x0) {
      pthread_cond_destroy((pthread_cond_t *)pbi->row_mt_cond_);
      aom_free(pbi->row_mt_cond_);
    }
    lVar4 = 0x5360;
    for (lVar3 = 0; lVar3 < pbi->allocated_tiles; lVar3 = lVar3 + 1) {
      av1_dec_row_mt_dealloc
                ((AV1DecRowMTSync *)
                 ((long)((pbi->tile_data->tctx).txb_skip_cdf + -2) + 0x3c + lVar4));
      lVar4 = lVar4 + 0x53a0;
    }
    aom_free(pbi->tile_data);
    aom_free(pbi->tile_workers);
    if (0 < pbi->num_workers) {
      av1_loop_filter_dealloc(&pbi->lf_row_sync);
      av1_loop_restoration_dealloc(&pbi->lr_row_sync);
      av1_dealloc_dec_jobs(&pbi->tile_mt_info);
    }
    av1_dec_free_cb_buf(pbi);
    av1_free_mc_tmp_buf(&pbi->td);
    aom_img_metadata_array_free(pbi->metadata);
    av1_remove_common(&pbi->common);
    aom_free(pbi);
    return;
  }
  return;
}

Assistant:

void av1_decoder_remove(AV1Decoder *pbi) {
  int i;

  if (!pbi) return;

  // Free the tile list output buffer.
  aom_free_frame_buffer(&pbi->tile_list_outbuf);

  aom_get_worker_interface()->end(&pbi->lf_worker);
  aom_free(pbi->lf_worker.data1);

  if (pbi->thread_data) {
    for (int worker_idx = 1; worker_idx < pbi->num_workers; worker_idx++) {
      DecWorkerData *const thread_data = pbi->thread_data + worker_idx;
      if (thread_data->td != NULL) {
        av1_free_mc_tmp_buf(thread_data->td);
        aom_free(thread_data->td);
      }
    }
    aom_free(pbi->thread_data);
  }
  aom_free(pbi->dcb.xd.seg_mask);

  for (i = 0; i < pbi->num_workers; ++i) {
    AVxWorker *const worker = &pbi->tile_workers[i];
    aom_get_worker_interface()->end(worker);
  }
#if CONFIG_MULTITHREAD
  if (pbi->row_mt_mutex_ != NULL) {
    pthread_mutex_destroy(pbi->row_mt_mutex_);
    aom_free(pbi->row_mt_mutex_);
  }
  if (pbi->row_mt_cond_ != NULL) {
    pthread_cond_destroy(pbi->row_mt_cond_);
    aom_free(pbi->row_mt_cond_);
  }
#endif
  for (i = 0; i < pbi->allocated_tiles; i++) {
    TileDataDec *const tile_data = pbi->tile_data + i;
    av1_dec_row_mt_dealloc(&tile_data->dec_row_mt_sync);
  }
  aom_free(pbi->tile_data);
  aom_free(pbi->tile_workers);

  if (pbi->num_workers > 0) {
    av1_loop_filter_dealloc(&pbi->lf_row_sync);
    av1_loop_restoration_dealloc(&pbi->lr_row_sync);
    av1_dealloc_dec_jobs(&pbi->tile_mt_info);
  }

  av1_dec_free_cb_buf(pbi);
#if CONFIG_ACCOUNTING
  aom_accounting_clear(&pbi->accounting);
#endif
  av1_free_mc_tmp_buf(&pbi->td);
  aom_img_metadata_array_free(pbi->metadata);
  av1_remove_common(&pbi->common);
  aom_free(pbi);
}